

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Neuron.cpp
# Opt level: O0

void __thiscall Neuron::watchFor(Neuron *this,vector<Neuron_*,_std::allocator<Neuron_*>_> *v)

{
  bool bVar1;
  bool local_39;
  __normal_iterator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_*,_std::vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>_>
  local_38;
  vector<Neuron_*,_std::allocator<Neuron_*>_> *local_30;
  __normal_iterator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_*,_std::vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>_>
  local_28;
  __normal_iterator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_*,_std::vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>_>
  local_20;
  vector<Neuron_*,_std::allocator<Neuron_*>_> *local_18;
  vector<Neuron_*,_std::allocator<Neuron_*>_> *v_local;
  Neuron *this_local;
  
  local_18 = v;
  v_local = (vector<Neuron_*,_std::allocator<Neuron_*>_> *)this;
  local_28._M_current =
       (vector<Neuron_*,_std::allocator<Neuron_*>_> *)
       std::
       vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
       ::begin(&this->m_watchFor);
  local_30 = (vector<Neuron_*,_std::allocator<Neuron_*>_> *)
             std::
             vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
             ::end(&this->m_watchFor);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<std::vector<Neuron*,std::allocator<Neuron*>>*,std::vector<std::vector<Neuron*,std::allocator<Neuron*>>,std::allocator<std::vector<Neuron*,std::allocator<Neuron*>>>>>,std::vector<Neuron*,std::allocator<Neuron*>>>
                       (local_28,(__normal_iterator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_*,_std::vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>_>
                                  )local_30,local_18);
  local_38._M_current =
       (vector<Neuron_*,_std::allocator<Neuron_*>_> *)
       std::
       vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
       ::end(&this->m_watchFor);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_38);
  local_39 = true;
  if (!bVar1) {
    local_39 = std::vector<Neuron_*,_std::allocator<Neuron_*>_>::empty(local_18);
  }
  if (local_39 == false) {
    std::
    vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
    ::push_back(&this->m_watchFor,local_18);
  }
  return;
}

Assistant:

void Neuron::watchFor(std::vector<Neuron*>& v)
{
    if (std::find(m_watchFor.begin(), m_watchFor.end(), v) != m_watchFor.end() || v.empty())
        return;

    m_watchFor.push_back(v);
}